

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update.cpp
# Opt level: O0

void __thiscall
duckdb::PhysicalUpdate::PhysicalUpdate
          (PhysicalUpdate *this,vector<duckdb::LogicalType,_true> *types,TableCatalogEntry *tableref
          ,DataTable *table,vector<duckdb::PhysicalIndex,_true> *columns,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *expressions,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *bound_defaults,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints,idx_t estimated_cardinality,bool return_chunk)

{
  bool bVar1;
  DataTableInfo *this_00;
  reference pPVar2;
  DataTable *in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar3;
  byte in_stack_00000020;
  ColumnDefinition *col_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<duckdb::ColumnDefinition,_true> *__range1_1;
  PhysicalIndex col;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::PhysicalIndex,_true> *__range1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  update_columns;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  index_columns;
  TableIndexList *indexes;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffffe08;
  PhysicalIndex in_stack_fffffffffffffe10;
  value_type *in_stack_fffffffffffffe18;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  PhysicalOperatorType type;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffffea8;
  _Node_iterator_base<unsigned_long,_false> local_148;
  _Node_iterator_base<unsigned_long,_false> local_140;
  idx_t local_138;
  _Node_iterator_base<unsigned_long,_false> local_130;
  reference local_128;
  ColumnDefinition *local_120;
  __normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
  local_118;
  vector<duckdb::ColumnDefinition,_true> *local_110;
  _Node_iterator_base<unsigned_long,_false> local_108;
  undefined1 local_100;
  idx_t local_f8;
  PhysicalIndex *local_f0;
  __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
  local_e8;
  undefined8 *local_e0;
  TableIndexList *local_68;
  byte local_31;
  DataTable *local_20;
  undefined8 local_18;
  
  type = (PhysicalOperatorType)((ulong)in_stack_fffffffffffffe28 >> 0x38);
  local_31 = in_stack_00000020 & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe10.index,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe08._M_cur);
  PhysicalOperator::PhysicalOperator
            ((PhysicalOperator *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),type,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe20,
             (idx_t)in_stack_fffffffffffffe18);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x187179f);
  *in_RDI = &PTR__PhysicalUpdate_0352f228;
  in_RDI[0x10] = local_18;
  in_RDI[0x11] = local_20;
  vector<duckdb::PhysicalIndex,_true>::vector
            ((vector<duckdb::PhysicalIndex,_true> *)in_stack_fffffffffffffe10.index,
             (vector<duckdb::PhysicalIndex,_true> *)in_stack_fffffffffffffe08._M_cur);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)in_stack_fffffffffffffe10.index,
           (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)in_stack_fffffffffffffe08._M_cur);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)in_stack_fffffffffffffe10.index,
           (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)in_stack_fffffffffffffe08._M_cur);
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
            *)in_stack_fffffffffffffe10.index,
           (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
            *)in_stack_fffffffffffffe08._M_cur);
  *(byte *)((long)in_RDI + 0xf1) = local_31 & 1;
  *(undefined1 *)((long)in_RDI + 0xf2) = 0;
  DataTable::GetDataTableInfo(local_20);
  this_00 = shared_ptr<duckdb::DataTableInfo,_true>::get
                      ((shared_ptr<duckdb::DataTableInfo,_true> *)0x1871886);
  local_68 = DataTableInfo::GetIndexes(this_00);
  TableIndexList::GetRequiredColumns((TableIndexList *)in_stack_fffffffffffffea8._M_cur);
  ::std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x18718cf);
  local_e0 = in_RDI + 0x12;
  local_e8._M_current =
       (PhysicalIndex *)
       ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::begin
                 ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                  in_stack_fffffffffffffe08._M_cur);
  local_f0 = (PhysicalIndex *)
             ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::end
                       ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                        in_stack_fffffffffffffe08._M_cur);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
                             *)in_stack_fffffffffffffe10.index,
                            (__normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
                             *)in_stack_fffffffffffffe08._M_cur), bVar1) {
    pPVar2 = __gnu_cxx::
             __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
             ::operator*(&local_e8);
    local_f8 = pPVar2->index;
    pVar3 = ::std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::insert(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_108._M_cur =
         (__node_type *)pVar3.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
    local_100 = pVar3.second;
    __gnu_cxx::
    __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
    ::operator++(&local_e8);
  }
  local_110 = DataTable::Columns(local_20);
  local_118._M_current =
       (ColumnDefinition *)
       ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::begin
                 ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)
                  in_stack_fffffffffffffe08._M_cur);
  local_120 = (ColumnDefinition *)
              ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::
              end((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)
                  in_stack_fffffffffffffe08._M_cur);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                        *)in_stack_fffffffffffffe10.index,
                       (__normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                        *)in_stack_fffffffffffffe08._M_cur);
    if (!bVar1) {
LAB_01871b98:
      ::std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x1871ba5);
      ::std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x1871bb2);
      return;
    }
    local_128 = __gnu_cxx::
                __normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                ::operator*(&local_118);
    local_138 = (idx_t)ColumnDefinition::Logical
                                 ((ColumnDefinition *)in_stack_fffffffffffffe08._M_cur);
    local_130._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::find(in_stack_fffffffffffffe08._M_cur,(key_type *)0x1871ab2);
    local_140._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end(in_stack_fffffffffffffe08._M_cur);
    bVar1 = ::std::__detail::operator==(&local_130,&local_140);
    if (!bVar1) {
      in_stack_fffffffffffffe10 =
           ColumnDefinition::Physical((ColumnDefinition *)in_stack_fffffffffffffe08._M_cur);
      in_stack_fffffffffffffe08._M_cur =
           (__node_type *)
           ::std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::find(in_stack_fffffffffffffe08._M_cur,(key_type *)0x1871b31);
      local_148._M_cur = in_stack_fffffffffffffe08._M_cur;
      ::std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             *)in_stack_fffffffffffffe08._M_cur);
      bVar1 = ::std::__detail::operator==
                        (&local_148,
                         (_Node_iterator_base<unsigned_long,_false> *)&stack0xfffffffffffffea8);
      if (!bVar1) {
        *(undefined1 *)((long)in_RDI + 0xf2) = 1;
        goto LAB_01871b98;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
    ::operator++(&local_118);
  } while( true );
}

Assistant:

PhysicalUpdate::PhysicalUpdate(vector<LogicalType> types, TableCatalogEntry &tableref, DataTable &table,
                               vector<PhysicalIndex> columns, vector<unique_ptr<Expression>> expressions,
                               vector<unique_ptr<Expression>> bound_defaults,
                               vector<unique_ptr<BoundConstraint>> bound_constraints, idx_t estimated_cardinality,
                               bool return_chunk)
    : PhysicalOperator(PhysicalOperatorType::UPDATE, std::move(types), estimated_cardinality), tableref(tableref),
      table(table), columns(std::move(columns)), expressions(std::move(expressions)),
      bound_defaults(std::move(bound_defaults)), bound_constraints(std::move(bound_constraints)),
      return_chunk(return_chunk), index_update(false) {

	auto &indexes = table.GetDataTableInfo().get()->GetIndexes();
	auto index_columns = indexes.GetRequiredColumns();

	unordered_set<column_t> update_columns;
	for (const auto col : this->columns) {
		update_columns.insert(col.index);
	}

	for (const auto &col : table.Columns()) {
		if (index_columns.find(col.Logical().index) == index_columns.end()) {
			continue;
		}
		if (update_columns.find(col.Physical().index) == update_columns.end()) {
			continue;
		}
		index_update = true;
		break;
	}
}